

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.h
# Opt level: O1

void __thiscall cmLinkImplItem::cmLinkImplItem(cmLinkImplItem *this)

{
  Snapshot local_30;
  
  (this->super_cmLinkItem).super_string._M_dataplus._M_p =
       (pointer)&(this->super_cmLinkItem).super_string.field_2;
  (this->super_cmLinkItem).super_string._M_string_length = 0;
  (this->super_cmLinkItem).super_string.field_2._M_local_buf[0] = '\0';
  (this->super_cmLinkItem).Target = (cmTarget *)0x0;
  cmState::Snapshot::Snapshot(&local_30,(cmState *)0x0,(PositionType)ZEXT816(0));
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Backtrace).Snapshot.State = local_30.State;
  (this->Backtrace).Snapshot.Position.Tree = local_30.Position.Tree;
  (this->Backtrace).Snapshot.Position.Position = local_30.Position.Position;
  this->FromGenex = false;
  return;
}

Assistant:

cmLinkImplItem(): cmLinkItem(), Backtrace(), FromGenex(false) {}